

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsproto.c
# Opt level: O2

int luaopen_sproto_core(lua_State *L)

{
  luaL_Reg l [10];
  
  luaL_checkversion_(L,503.0,0x88);
  memcpy(l,&PTR_anon_var_dwarf_21c9d_00160df0,0xa0);
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,9);
  luaL_setfuncs(L,l,0);
  pushfunction_withbuffer(L,"encode",lencode);
  pushfunction_withbuffer(L,"pack",lpack);
  pushfunction_withbuffer(L,"unpack",lunpack);
  return 1;
}

Assistant:

int
luaopen_sproto_core(lua_State *L) {
#ifdef luaL_checkversion
	luaL_checkversion(L);
#endif
	luaL_Reg l[] = {
		{ "newproto", lnewproto },
		{ "deleteproto", ldeleteproto },
		{ "dumpproto", ldumpproto },
		{ "querytype", lquerytype },
		{ "decode", ldecode },
		{ "protocol", lprotocol },
		{ "loadproto", lloadproto },
		{ "saveproto", lsaveproto },
		{ "default", ldefault },
		{ NULL, NULL },
	};
	luaL_newlib(L,l);
	pushfunction_withbuffer(L, "encode", lencode);
	pushfunction_withbuffer(L, "pack", lpack);
	pushfunction_withbuffer(L, "unpack", lunpack);
	return 1;
}